

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalFlushFileBuffers(CPalThread *pThread,HANDLE hFile)

{
  int iVar1;
  int *piVar2;
  undefined8 *local_38;
  IDataLock *pLocalDataLock;
  CFileProcessLocalData *pLocalData;
  IPalObject *pFileObject;
  HANDLE pVStack_18;
  PAL_ERROR palError;
  HANDLE hFile_local;
  CPalThread *pThread_local;
  
  pFileObject._4_4_ = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  local_38 = (undefined8 *)0x0;
  pVStack_18 = hFile;
  hFile_local = pThread;
  if ((undefined1 *)hFile == &DAT_ffffffffffffffff) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    pFileObject._4_4_ = 6;
  }
  else {
    pFileObject._4_4_ =
         (**(code **)(*g_pObjectManager + 0x28))
                   (g_pObjectManager,pThread,hFile,aotFile,0x40000000,&pLocalData);
    if ((pFileObject._4_4_ == 0) &&
       (pFileObject._4_4_ =
             (*(code *)pLocalData->pLockController[3]._vptr_IFileLockController)
                       (pLocalData,hFile_local,0,&local_38,&pLocalDataLock), pFileObject._4_4_ == 0)
       ) {
      if (*(int *)((long)&pLocalDataLock[2]._vptr_IDataLock + 4) == 1) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        pFileObject._4_4_ = 5;
      }
      else {
        do {
          iVar1 = fsync(*(int *)&pLocalDataLock[1]._vptr_IDataLock);
          if (iVar1 == 0) break;
          piVar2 = __errno_location();
          if (*piVar2 == 4) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
          }
          else {
            pFileObject._4_4_ = FILEGetLastErrorFromErrno();
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
          }
        } while (pFileObject._4_4_ == 0);
      }
    }
  }
  if (local_38 != (undefined8 *)0x0) {
    (**(code **)*local_38)(local_38,hFile_local,0);
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController[8]._vptr_IFileLockController)(pLocalData,hFile_local);
  }
  return pFileObject._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalFlushFileBuffers(
    CPalThread *pThread,
    HANDLE hFile
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto InternalFlushFileBuffersExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_WRITE,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalFlushFileBuffersExit;
    }
    
    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalFlushFileBuffersExit;
    }

    if (pLocalData->open_flags_deviceaccessonly == TRUE)
    {
        ERROR("File open for device access only\n");
        palError = ERROR_ACCESS_DENIED;
        goto InternalFlushFileBuffersExit;
    }

#if HAVE_FSYNC || defined(__APPLE__)
    do
    {

#if defined(__APPLE__)
        if (fcntl(pLocalData->unix_fd, F_FULLFSYNC) != -1)
            break;
#else // __APPLE__
        if (fsync(pLocalData->unix_fd) == 0)
            break;
#endif // __APPLE__
            
        switch (errno)
        {
        case EINTR:
            // Execution was interrupted by a signal, so restart.
            TRACE("fsync(%d) was interrupted. Restarting\n", pLocalData->unix_fd);
            break;
            
        default:
            palError = FILEGetLastErrorFromErrno();
            WARN("fsync(%d) failed with error %d\n", pLocalData->unix_fd, errno);
            break;
        }
    } while (NO_ERROR == palError);    
#else // HAVE_FSYNC
    /* flush all buffers out to disk - there is no way to flush
       an individual file descriptor's buffers out. */
    sync();
#endif // HAVE_FSYNC else
    

InternalFlushFileBuffersExit:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}